

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<1024U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::operator*=
          (uintwide_t<1024U,_unsigned_int,_void,_false> *this,
          uintwide_t<1024U,_unsigned_int,_void,_false> *other)

{
  long lVar1;
  value_type_conflict *pvVar2;
  value_type_conflict *pvVar3;
  uintwide_t<1024U,_unsigned_int,_void,_false> *puVar4;
  byte bVar5;
  uintwide_t<1024U,_unsigned_int,_void,_false> other_as_self_copy;
  value_type_conflict local_118 [34];
  value_type_conflict local_90 [32];
  
  bVar5 = 0;
  if (this == other) {
    pvVar2 = (value_type_conflict *)other;
    pvVar3 = local_90;
    for (lVar1 = 0x20; other = (uintwide_t<1024U,_unsigned_int,_void,_false> *)local_90, lVar1 != 0;
        lVar1 = lVar1 + -1) {
      *pvVar3 = *pvVar2;
      pvVar2 = pvVar2 + 1;
      pvVar3 = pvVar3 + 1;
    }
  }
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  eval_multiply_n_by_n_to_lo_part<unsigned_int_*,_const_unsigned_int_*,_const_unsigned_int_*,_1024U,_nullptr>
            (local_118,(uint *)this,(uint *)other,0x20);
  pvVar2 = local_118;
  puVar4 = this;
  for (lVar1 = 0x20; lVar1 != 0; lVar1 = lVar1 + -1) {
    (puVar4->values).super_array<unsigned_int,_32UL>.elems[0] = *pvVar2;
    pvVar2 = pvVar2 + (ulong)bVar5 * -2 + 1;
    puVar4 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
             ((long)puVar4 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }